

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O2

Sym_Man_t * Sym_ManStart(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  Sym_Man_t *pSVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  Extra_BitMat_t *pEVar7;
  uint *puVar8;
  Vec_Vec_t *pVVar9;
  void **ppvVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint nSize;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  
  pSVar2 = (Sym_Man_t *)calloc(1,0xf8);
  pSVar2->pNtk = pNtk;
  uVar12 = 0;
  pVVar3 = Abc_NtkDfs(pNtk,0);
  pSVar2->vNodes = pVVar3;
  nSize = pNtk->vCis->nSize;
  pSVar2->nInputs = nSize;
  uVar16 = pNtk->vCos->nSize;
  iVar15 = (((int)nSize >> 5) + 1) - (uint)((nSize & 0x1f) == 0);
  pSVar2->nOutputs = uVar16;
  pSVar2->nSimWords = iVar15;
  pVVar3 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,iVar15,0);
  pSVar2->vSim = pVVar3;
  pVVar3 = Vec_PtrStart(uVar16);
  pSVar2->vMatrSymms = pVVar3;
  pVVar4 = Vec_PtrStart(uVar16);
  pSVar2->vMatrNonSymms = pVVar4;
  pVVar5 = Vec_IntStart(uVar16);
  pSVar2->vPairsTotal = pVVar5;
  pVVar5 = Vec_IntStart(uVar16);
  pSVar2->vPairsSym = pVVar5;
  pVVar5 = Vec_IntStart(uVar16);
  pSVar2->vPairsNonSym = pVVar5;
  uVar6 = 0;
  if (0 < (int)uVar16) {
    uVar6 = (ulong)uVar16;
  }
  for (; uVar6 != uVar12; uVar12 = uVar12 + 1) {
    pEVar7 = Extra_BitMatrixStart(nSize);
    pVVar3->pArray[uVar12] = pEVar7;
    pEVar7 = Extra_BitMatrixStart(nSize);
    pVVar4->pArray[uVar12] = pEVar7;
  }
  sVar19 = (long)iVar15 << 2;
  puVar8 = (uint *)malloc(sVar19);
  pSVar2->uPatRand = puVar8;
  puVar8 = (uint *)malloc(sVar19);
  pSVar2->uPatCol = puVar8;
  puVar8 = (uint *)malloc(sVar19);
  pSVar2->uPatRow = puVar8;
  pVVar5 = Vec_IntStart(100);
  pSVar2->vVarsU = pVVar5;
  pVVar5 = Vec_IntStart(100);
  pSVar2->vVarsV = pVVar5;
  pVVar3 = Sim_ComputeFunSupp(pNtk,fVerbose);
  pSVar2->vSuppFun = pVVar3;
  pVVar9 = Vec_VecStart(uVar16);
  pSVar2->vSupports = pVVar9;
  uVar12 = 0;
  if ((int)nSize < 1) {
    nSize = 0;
  }
  do {
    uVar18 = uVar12;
    if (uVar18 == uVar6) {
      return pSVar2;
    }
    sVar19 = uVar18 * 8 + 8;
    iVar15 = (int)(uVar18 + 1);
    uVar17 = 0;
    while (uVar16 = (uint)uVar17, uVar12 = uVar18 + 1, uVar16 != nSize) {
      if ((*(uint *)((long)pVVar3->pArray[uVar18] + (uVar17 >> 5) * 4) >> (uVar16 & 0x1f) & 1) != 0)
      {
        lVar13 = (long)pVVar9->nSize;
        if (lVar13 <= (long)uVar18) {
          if ((long)pVVar9->nCap <= (long)uVar18) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(sVar19);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,sVar19);
              lVar13 = (long)pVVar9->nSize;
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = iVar15;
          }
          for (; lVar13 <= (long)uVar18; lVar13 = lVar13 + 1) {
            pVVar5 = Vec_IntAlloc(0);
            pVVar9->pArray[lVar13] = pVVar5;
          }
          pVVar9->nSize = iVar15;
          lVar13 = (long)iVar15;
        }
        if (lVar13 <= (long)uVar18) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        puVar8 = (uint *)pVVar9->pArray[uVar18];
        uVar1 = puVar8[1];
        if (uVar1 == *puVar8) {
          uVar14 = uVar1 * 2;
          if ((int)uVar1 < 0x10) {
            uVar14 = 0x10;
          }
          if ((int)uVar1 < (int)uVar14) {
            if (*(void **)(puVar8 + 2) == (void *)0x0) {
              pvVar11 = malloc((ulong)uVar14 << 2);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar8 + 2),(ulong)uVar14 << 2);
            }
            *(void **)(puVar8 + 2) = pvVar11;
            if (pvVar11 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *puVar8 = uVar14;
            uVar1 = puVar8[1];
          }
        }
        puVar8[1] = uVar1 + 1;
        *(uint *)(*(long *)(puVar8 + 2) + (long)(int)uVar1 * 4) = uVar16;
      }
      uVar17 = (ulong)(uVar16 + 1);
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the simulation manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sym_Man_t * Sym_ManStart( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    int i, v; 
    // start the manager
    p = ABC_ALLOC( Sym_Man_t, 1 );
    memset( p, 0, sizeof(Sym_Man_t) );
    p->pNtk = pNtk;
    p->vNodes     = Abc_NtkDfs( pNtk, 0 );
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimWords  = SIM_NUM_WORDS(p->nInputs);
    p->vSim       = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    // symmetry info for each output
    p->vMatrSymms    = Vec_PtrStart( p->nOutputs );
    p->vMatrNonSymms = Vec_PtrStart( p->nOutputs );
    p->vPairsTotal   = Vec_IntStart( p->nOutputs );
    p->vPairsSym     = Vec_IntStart( p->nOutputs );
    p->vPairsNonSym  = Vec_IntStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        p->vMatrSymms->pArray[i]    = Extra_BitMatrixStart( p->nInputs );
        p->vMatrNonSymms->pArray[i] = Extra_BitMatrixStart( p->nInputs );
    }
    // temporary patterns
    p->uPatRand = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatCol  = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatRow  = ABC_ALLOC( unsigned, p->nSimWords );
    p->vVarsU   = Vec_IntStart( 100 );
    p->vVarsV   = Vec_IntStart( 100 );
    // compute supports
    p->vSuppFun  = Sim_ComputeFunSupp( pNtk, fVerbose );
    p->vSupports = Vec_VecStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
        for ( v = 0; v < p->nInputs; v++ )
            if ( Sim_SuppFunHasVar( p->vSuppFun, i, v ) )
                Vec_VecPushInt( p->vSupports, i, v );
    return p;
}